

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb,RK_S32 *poc,RK_S32 *pos)

{
  int local_30;
  RK_S32 local_2c;
  RK_S32 min_poc;
  RK_S32 min_pos;
  RK_S32 find_flag;
  RK_U32 i;
  RK_S32 *pos_local;
  RK_S32 *poc_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  min_poc = 0;
  local_2c = -1;
  local_30 = 0x7fffffff;
  *pos = -1;
  *poc = 0x7fffffff;
  for (min_pos = 0; (uint)min_pos < p_Dpb->used_size; min_pos = min_pos + 1) {
    if (p_Dpb->fs[(uint)min_pos]->poc < local_30) {
      local_30 = p_Dpb->fs[(uint)min_pos]->poc;
      local_2c = min_pos;
    }
    if ((p_Dpb->fs[(uint)min_pos]->poc < *poc) && (p_Dpb->fs[(uint)min_pos]->is_output == 0)) {
      *poc = p_Dpb->fs[(uint)min_pos]->poc;
      *pos = min_pos;
      min_poc = 1;
    }
  }
  if (min_poc == 0) {
    *poc = local_30;
    *pos = local_2c;
  }
  return min_poc;
}

Assistant:

static RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb, RK_S32 *poc, RK_S32 *pos)
{
    RK_U32 i = 0;
    RK_S32 find_flag = 0;
    RK_S32 min_pos = -1;
    RK_S32 min_poc = INT_MAX;

    *pos = -1;
    *poc = INT_MAX;
    for (i = 0; i < p_Dpb->used_size; i++) {
        if (min_poc > p_Dpb->fs[i]->poc) {
            min_poc = p_Dpb->fs[i]->poc;
            min_pos = i;
        }
        if ((*poc > p_Dpb->fs[i]->poc) && (!p_Dpb->fs[i]->is_output)) {
            *poc = p_Dpb->fs[i]->poc;
            *pos = i;
            find_flag = 1;
        }
    }
    if (!find_flag) {
        *poc = min_poc;
        *pos = min_pos;
    }

    return find_flag;
}